

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<4> __thiscall
embree::sse2::GeneralBVHBuilder::
BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleM<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleM<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
          *this,BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  PrimInfoExtRange *set;
  byte bVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  ThreadLocal2 *this_00;
  float fVar6;
  float fVar7;
  float fVar8;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  char cVar9;
  size_t i_1;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  *p_Var10;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  this_01;
  ulong uVar11;
  NodeRefPtr<4> NVar12;
  long lVar13;
  Vec3fa *pVVar14;
  ulong uVar15;
  size_t sVar16;
  runtime_error *this_02;
  unsigned_long *puVar17;
  ulong uVar18;
  AABBNode_t<embree::NodeRefPtr<4>,_4> *node;
  undefined1 *puVar19;
  char *pcVar20;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *current_00;
  size_t i_3;
  bool bVar21;
  float fVar22;
  float fVar23;
  Split split_1;
  NodeRefPtr<4> values [16];
  Split split;
  PrimInfoExtRange rprims;
  PrimInfoExtRange lprims;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  anon_class_24_3_c379faaa local_a58;
  undefined1 local_a40 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a00;
  unsigned_long local_9f0;
  unsigned_long uStack_9e8;
  unsigned_long local_9e0;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_9c0;
  anon_class_8_1_898bcfc2_conflict local_938;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_930;
  Split local_8c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_840;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_810;
  undefined8 uStack_808;
  unsigned_long local_800;
  unsigned_long uStack_7f8;
  unsigned_long local_7f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_7e0;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  unsigned_long local_7a0;
  unsigned_long uStack_798;
  unsigned_long local_790;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_780 [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc->super_Create).allocator;
    p_Var10 = (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
               *)__tls_get_addr(&PTR_021f8d38);
    this_01._M_t.
    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
         p_Var10->_M_t;
    if ((_Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         )this_01._M_t.
          super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
          .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl ==
        (ThreadLocal2 *)0x0) {
      this_01._M_t.
      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
           (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            )FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys((MutexSys *)
                         this_01._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl);
      (((atomic<embree::FastAllocator_*> *)
       ((long)this_01._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8)
       )->_M_b)._M_p = (__pointer_type)0x0;
      ((ThreadLocal *)
      ((long)this_01._M_t.
             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
      0x40))->parent =
           (ThreadLocal2 *)
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x48) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x50) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x58) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x60) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x68) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x70) = (void *)0x0;
      ((ThreadLocal *)
      ((long)this_01._M_t.
             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
      0x80))->parent =
           (ThreadLocal2 *)
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x88) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x90) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x98) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa8) = (void *)0x0;
      *(void **)((long)this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xb0) = (void *)0x0;
      p_Var10->_M_t =
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      local_780[0].depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      local_780[0].alloc_barrier = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_a40._0_8_ =
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)local_a40);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)local_a40);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_780);
    }
    alloc.talloc0 =
         (ThreadLocal *)
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x40);
    alloc.talloc1 =
         (ThreadLocal *)
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x80);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
  }
  set = &current->prims;
  HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::find
            (&local_8c0,this->heuristic,set,(this->cfg).logBlockSize);
  bVar3 = (byte)(this->cfg).logBlockSize;
  uVar4 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  uVar5 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin;
  uVar11 = uVar4 - uVar5;
  if (((uVar11 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) ||
     ((uVar11 <= (this->cfg).maxLeafSize &&
      (fVar22 = (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[1] -
                (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[1],
      fVar23 = (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[2] -
               (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[2],
      fVar23 = (fVar22 + fVar23) *
               ((current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[0] -
               (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[0]) +
               fVar23 * fVar22, fVar22 = (this->cfg).intCost,
      (float)((~(-1L << (bVar3 & 0x3f)) + uVar4) - uVar5 >> (bVar3 & 0x3f)) * fVar23 * fVar22 <=
      fVar23 * (this->cfg).travCost + fVar22 * local_8c0.sah)))) {
    HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    deterministic_order(this->heuristic,set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    NVar12 = createLargeLeaf(this,current,alloc_00);
    return (NodeRefPtr<4>)NVar12.ptr;
  }
  HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
  split(this->heuristic,&local_8c0,set,(PrimInfoExtRange *)&local_7e0.field_1,
        (PrimInfoExtRange *)&local_840.field_1);
  local_a40._0_8_ = current->depth + 1;
  local_a40[8] = false;
  local_a30._0_8_ = local_7e0._0_8_;
  local_a30._8_8_ = local_7e0._8_8_;
  local_a20._0_8_ = local_7d0;
  local_a20._8_8_ = uStack_7c8;
  local_a10._0_8_ = local_7c0;
  local_a10._8_8_ = uStack_7b8;
  local_a00._0_8_ = local_7b0;
  local_a00._8_8_ = uStack_7a8;
  local_9f0 = local_7a0;
  uStack_9e8 = uStack_798;
  local_9e0 = local_790;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  ::operator=(local_780,
              (BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
               *)local_a40);
  local_a40._0_8_ = current->depth + 1;
  local_a40[8] = false;
  local_a30._0_8_ = local_840._0_8_;
  local_a30._8_8_ = local_840._8_8_;
  local_a20._0_8_ = local_830;
  local_a20._8_8_ = uStack_828;
  local_a00._0_8_ = local_810;
  local_a00._8_8_ = uStack_808;
  local_9f0 = local_800;
  uStack_9e8 = uStack_7f8;
  local_9e0 = local_7f0;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  ::operator=(local_780 + 1,
              (BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
               *)local_a40);
  for (uVar11 = 2; uVar11 < (this->cfg).branchingFactor; uVar11 = uVar11 + 1) {
    puVar17 = &local_780[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
               _end;
    uVar15 = 0xffffffffffffffff;
    fVar22 = -INFINITY;
    for (uVar18 = 0; uVar11 != uVar18; uVar18 = uVar18 + 1) {
      if (((this->cfg).minLeafSize < *puVar17 - ((range<unsigned_long> *)(puVar17 + -1))->_begin) &&
         (fVar23 = *(float *)((long)puVar17 + -0x34) - *(float *)((long)puVar17 + -0x44),
         fVar23 = (fVar23 + (*(float *)(puVar17 + -6) - *(float *)(puVar17 + -8))) *
                  (*(float *)(puVar17 + -7) - *(float *)(puVar17 + -9)) +
                  (*(float *)(puVar17 + -6) - *(float *)(puVar17 + -8)) * fVar23, fVar22 < fVar23))
      {
        uVar15 = uVar18;
        fVar22 = fVar23;
      }
      puVar17 = puVar17 + 0xe;
    }
    if (uVar15 == 0xffffffffffffffff) break;
    local_9c0.depth = current->depth + 1;
    local_9c0.alloc_barrier = false;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ = 0xff800000ff800000;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ = 0xff800000ff800000;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ = 0xff800000ff800000;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ = 0xff800000ff800000;
    local_9c0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin = 0;
    local_9c0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end = 0;
    local_9c0.prims.super_extended_range<unsigned_long>._ext_end = 0;
    local_930._8_8_ = local_930._8_8_ & 0xffffffffffffff00;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ = 0xff800000ff800000;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ = 0xff800000ff800000;
    local_930.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
    local_930.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
    local_930.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ = 0xff800000ff800000;
    local_930.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ = 0xff800000ff800000;
    local_930.prims.super_extended_range<unsigned_long>._ext_end = 0;
    local_930.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin = 0;
    local_930.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end = 0;
    local_930.depth = local_9c0.depth;
    HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    find((Split *)local_a40,this->heuristic,&local_780[uVar15].prims,(this->cfg).logBlockSize);
    HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    split(this->heuristic,(Split *)local_a40,&local_780[uVar15].prims,&local_9c0.prims,
          &local_930.prims);
    BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
    ::operator=(local_780 + uVar15,&local_9c0);
    BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
    ::operator=(local_780 + uVar11,&local_930);
  }
  uVar15 = (this->cfg).primrefarrayalloc;
  if (uVar15 < (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end
               - (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _begin) {
    puVar17 = &local_780[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
               _end;
    uVar18 = uVar11;
    while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
      *(bool *)(puVar17 + -10) =
           *puVar17 - ((range<unsigned_long> *)(puVar17 + -1))->_begin <= uVar15;
      puVar17 = puVar17 + 0xe;
    }
  }
  current_00 = local_780;
  std::
  __sort<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>>>>
            (current_00,local_780 + uVar11);
  local_a58.values = (NodeRefPtr<4> (*) [16])&DAT_00000080;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_9c0.alloc_barrier = true;
    local_9c0.depth = (size_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_a40._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_a40[8] = true;
    local_930.depth = (size_t)this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&local_930);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_a40);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_9c0);
  }
  (alloc.talloc0)->bytesUsed =
       (size_t)((long)&((MutexSys *)*local_a58.values)->mutex + (alloc.talloc0)->bytesUsed);
  sVar16 = (alloc.talloc0)->cur;
  uVar15 = (ulong)(-(int)sVar16 & 0xf);
  puVar19 = (undefined1 *)((long)&((MutexSys *)*local_a58.values)->mutex + uVar15 + sVar16);
  (alloc.talloc0)->cur = (size_t)puVar19;
  if ((undefined1 *)(alloc.talloc0)->end < puVar19) {
    (alloc.talloc0)->cur = sVar16;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize <
        (ThreadLocal2 *)((long)local_a58.values << 2)) {
      pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_a58);
    }
    else {
      local_a40._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_a40);
      (alloc.talloc0)->ptr = pcVar20;
      sVar16 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar16;
      (alloc.talloc0)->end = local_a40._0_8_;
      (alloc.talloc0)->cur = (size_t)local_a58.values;
      if ((ulong)local_a40._0_8_ < local_a58.values) {
        (alloc.talloc0)->cur = 0;
        local_a40._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_a40);
        (alloc.talloc0)->ptr = pcVar20;
        sVar16 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar16;
        (alloc.talloc0)->end = local_a40._0_8_;
        (alloc.talloc0)->cur = (size_t)local_a58.values;
        if ((ulong)local_a40._0_8_ < local_a58.values) {
          (alloc.talloc0)->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_004865a8;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar16;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar15;
    pcVar20 = (alloc.talloc0)->ptr + ((long)puVar19 - (long)local_a58.values);
  }
LAB_004865a8:
  pcVar20[0x60] = '\0';
  pcVar20[0x61] = '\0';
  pcVar20[0x62] = -0x80;
  pcVar20[99] = '\x7f';
  pcVar20[100] = '\0';
  pcVar20[0x65] = '\0';
  pcVar20[0x66] = -0x80;
  pcVar20[0x67] = '\x7f';
  pcVar20[0x68] = '\0';
  pcVar20[0x69] = '\0';
  pcVar20[0x6a] = -0x80;
  pcVar20[0x6b] = '\x7f';
  pcVar20[0x6c] = '\0';
  pcVar20[0x6d] = '\0';
  pcVar20[0x6e] = -0x80;
  pcVar20[0x6f] = '\x7f';
  pcVar20[0x40] = '\0';
  pcVar20[0x41] = '\0';
  pcVar20[0x42] = -0x80;
  pcVar20[0x43] = '\x7f';
  pcVar20[0x44] = '\0';
  pcVar20[0x45] = '\0';
  pcVar20[0x46] = -0x80;
  pcVar20[0x47] = '\x7f';
  pcVar20[0x48] = '\0';
  pcVar20[0x49] = '\0';
  pcVar20[0x4a] = -0x80;
  pcVar20[0x4b] = '\x7f';
  pcVar20[0x4c] = '\0';
  pcVar20[0x4d] = '\0';
  pcVar20[0x4e] = -0x80;
  pcVar20[0x4f] = '\x7f';
  pcVar20[0x20] = '\0';
  pcVar20[0x21] = '\0';
  pcVar20[0x22] = -0x80;
  pcVar20[0x23] = '\x7f';
  pcVar20[0x24] = '\0';
  pcVar20[0x25] = '\0';
  pcVar20[0x26] = -0x80;
  pcVar20[0x27] = '\x7f';
  pcVar20[0x28] = '\0';
  pcVar20[0x29] = '\0';
  pcVar20[0x2a] = -0x80;
  pcVar20[0x2b] = '\x7f';
  pcVar20[0x2c] = '\0';
  pcVar20[0x2d] = '\0';
  pcVar20[0x2e] = -0x80;
  pcVar20[0x2f] = '\x7f';
  pcVar20[0x70] = '\0';
  pcVar20[0x71] = '\0';
  pcVar20[0x72] = -0x80;
  pcVar20[0x73] = -1;
  pcVar20[0x74] = '\0';
  pcVar20[0x75] = '\0';
  pcVar20[0x76] = -0x80;
  pcVar20[0x77] = -1;
  pcVar20[0x78] = '\0';
  pcVar20[0x79] = '\0';
  pcVar20[0x7a] = -0x80;
  pcVar20[0x7b] = -1;
  pcVar20[0x7c] = '\0';
  pcVar20[0x7d] = '\0';
  pcVar20[0x7e] = -0x80;
  pcVar20[0x7f] = -1;
  pcVar20[0x50] = '\0';
  pcVar20[0x51] = '\0';
  pcVar20[0x52] = -0x80;
  pcVar20[0x53] = -1;
  pcVar20[0x54] = '\0';
  pcVar20[0x55] = '\0';
  pcVar20[0x56] = -0x80;
  pcVar20[0x57] = -1;
  pcVar20[0x58] = '\0';
  pcVar20[0x59] = '\0';
  pcVar20[0x5a] = -0x80;
  pcVar20[0x5b] = -1;
  pcVar20[0x5c] = '\0';
  pcVar20[0x5d] = '\0';
  pcVar20[0x5e] = -0x80;
  pcVar20[0x5f] = -1;
  pcVar20[0x30] = '\0';
  pcVar20[0x31] = '\0';
  pcVar20[0x32] = -0x80;
  pcVar20[0x33] = -1;
  pcVar20[0x34] = '\0';
  pcVar20[0x35] = '\0';
  pcVar20[0x36] = -0x80;
  pcVar20[0x37] = -1;
  pcVar20[0x38] = '\0';
  pcVar20[0x39] = '\0';
  pcVar20[0x3a] = -0x80;
  pcVar20[0x3b] = -1;
  pcVar20[0x3c] = '\0';
  pcVar20[0x3d] = '\0';
  pcVar20[0x3e] = -0x80;
  pcVar20[0x3f] = -1;
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    pcVar2 = pcVar20 + lVar13 * 8;
    pcVar2[0] = '\b';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
  }
  pVVar14 = &local_780[0].prims.super_CentGeomBBox3fa.geomBounds.upper;
  for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
    fVar22 = (((BBox<embree::Vec3fa> *)(pVVar14 + -1))->lower).field_0.m128[1];
    fVar23 = (((BBox<embree::Vec3fa> *)(pVVar14 + -1))->lower).field_0.m128[2];
    fVar6 = (pVVar14->field_0).m128[0];
    fVar7 = (pVVar14->field_0).m128[1];
    fVar8 = (pVVar14->field_0).m128[2];
    *(float *)(pcVar20 + uVar15 * 4 + 0x20) =
         (((BBox<embree::Vec3fa> *)(pVVar14 + -1))->lower).field_0.m128[0];
    *(float *)(pcVar20 + uVar15 * 4 + 0x40) = fVar22;
    *(float *)(pcVar20 + uVar15 * 4 + 0x60) = fVar23;
    *(float *)(pcVar20 + uVar15 * 4 + 0x30) = fVar6;
    *(float *)(pcVar20 + uVar15 * 4 + 0x50) = fVar7;
    *(float *)(pcVar20 + uVar15 * 4 + 0x70) = fVar8;
    pVVar14 = pVVar14 + 7;
  }
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    local_a58.values = (NodeRefPtr<4> (*) [16])&local_9c0;
    local_a58.children = &local_780;
    local_a58.this = this;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)local_a40,(context_traits)0x4,CUSTOM_CTX);
    local_930.alloc_barrier = false;
    local_930._9_7_ = 0;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 1;
    local_938.func = &local_a58;
    local_930.depth = uVar11;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::GeneralBVHBuilder::BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::sse2::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<4>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>___ge<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)&local_930,&local_938,(task_group_context *)local_a40
              );
    cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_a40);
    if (cVar9 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)local_a40);
    for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
      *(size_t *)(pcVar20 + uVar15 * 8) = (&local_9c0.depth)[uVar15];
    }
  }
  else {
    for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      NVar12 = recurse(this,current_00,alloc_01,false);
      (&local_9c0.depth)[uVar15] = NVar12.ptr;
      current_00 = current_00 + 1;
    }
    for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
      *(size_t *)(pcVar20 + uVar15 * 8) = (&local_9c0.depth)[uVar15];
    }
  }
  return (NodeRefPtr<4>)(size_t)pcVar20;
}

Assistant:

const ReductionTy recurse(BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            auto split = heuristic.find(current.prims,cfg.logBlockSize);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*halfArea(current.prims.geomBounds)+cfg.intCost*split.splitSAH();
            assert((current.prims.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.prims.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.prims.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              heuristic.deterministic_order(current.prims);
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            Set lprims,rprims;
            heuristic.split(split,current.prims,lprims,rprims);
	    
            /*! initialize child list with initial split */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            children[0] = BuildRecord(current.depth+1,lprims);
            children[1] = BuildRecord(current.depth+1,rprims);
            size_t numChildren = 2;

            /*! split until node is full or SAH tells us to stop */
            while (numChildren < cfg.branchingFactor)
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.minLeafSize) continue;

                /* find child with largest surface area */
                if (halfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i;
                  bestArea = halfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              auto split = heuristic.find(brecord.prims,cfg.logBlockSize);
              heuristic.split(split,brecord.prims,lrecord.prims,rrecord.prims);
              children[bestChild  ] = lrecord;
              children[numChildren] = rrecord;
              numChildren++;
            }

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* sort buildrecords for faster shadow ray traversal */
            std::sort(&children[0],&children[numChildren],std::greater<BuildRecord>());

            /*! create an inner node */
            auto node = createNode(children,numChildren,alloc);

            /* spawn tasks */
            if (current.size() > cfg.singleThreadThreshold)
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) { // FIXME: no range here
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              return updateNode(current,children,node,values,numChildren);
            }
            /* recurse into each child */
            else
            {
              for (size_t i=0; i<numChildren; i++)
                values[i] = recurse(children[i],alloc,false);

              return updateNode(current,children,node,values,numChildren);
            }
          }